

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

Vec_Int_t *
Gia_ManFxTopoOrder(Vec_Wec_t *vCubes,int nInputs,int nStart,Vec_Int_t **pvFirst,Vec_Int_t **pvCount)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p;
  Vec_Int_t *pVVar4;
  int local_64;
  int nNodeMax;
  int iFanin;
  int i;
  Vec_Int_t *vCube;
  Vec_Int_t *vVisit;
  Vec_Int_t *vCount;
  Vec_Int_t *vFirst;
  Vec_Int_t *vOrder;
  Vec_Int_t **pvCount_local;
  Vec_Int_t **pvFirst_local;
  int nStart_local;
  int nInputs_local;
  Vec_Wec_t *vCubes_local;
  
  local_64 = -1;
  for (nNodeMax = 0; iVar1 = Vec_WecSize(vCubes), nNodeMax < iVar1; nNodeMax = nNodeMax + 1) {
    pVVar3 = Vec_WecEntry(vCubes,nNodeMax);
    iVar1 = Vec_IntEntry(pVVar3,0);
    local_64 = Abc_MaxInt(local_64,iVar1);
  }
  local_64 = local_64 + 1;
  if (local_64 == nStart) {
    vCubes_local = (Vec_Wec_t *)0x0;
  }
  else {
    pVVar3 = Vec_IntStart(local_64);
    p = Vec_IntStart(local_64);
    for (nNodeMax = 0; iVar1 = Vec_WecSize(vCubes), nNodeMax < iVar1; nNodeMax = nNodeMax + 1) {
      pVVar4 = Vec_WecEntry(vCubes,nNodeMax);
      iVar1 = Vec_IntEntry(pVVar4,0);
      if (iVar1 < nInputs) {
        __assert_fail("iFanin >= nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                      ,0x126,
                      "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                     );
      }
      iVar2 = Vec_IntEntry(p,iVar1);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(pVVar3,iVar1,nNodeMax);
      }
      Vec_IntAddToEntry(p,iVar1,1);
    }
    vCubes_local = (Vec_Wec_t *)Vec_IntStart(nInputs);
    pVVar4 = Vec_IntStart(local_64);
    for (nNodeMax = 0; iVar1 = nInputs, nNodeMax < nInputs; nNodeMax = nNodeMax + 1) {
      Vec_IntWriteEntry(pVVar4,nNodeMax,1);
    }
    while (nNodeMax = iVar1, nNodeMax < local_64) {
      iVar1 = Vec_IntEntry(pVVar4,nNodeMax);
      if (iVar1 == 0) {
        Gia_ManFxTopoOrder_rec(vCubes,pVVar3,p,pVVar4,(Vec_Int_t *)vCubes_local,nNodeMax);
      }
      iVar1 = nNodeMax + 1;
    }
    iVar1 = Vec_IntSize((Vec_Int_t *)vCubes_local);
    if (iVar1 != local_64) {
      __assert_fail("Vec_IntSize(vOrder) == nNodeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                    ,0x133,
                    "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                   );
    }
    Vec_IntFree(pVVar4);
    *pvFirst = pVVar3;
    *pvCount = p;
  }
  return (Vec_Int_t *)vCubes_local;
}

Assistant:

Vec_Int_t * Gia_ManFxTopoOrder( Vec_Wec_t * vCubes, int nInputs, int nStart, Vec_Int_t ** pvFirst, Vec_Int_t ** pvCount )
{
    Vec_Int_t * vOrder, * vFirst, * vCount, * vVisit, * vCube;
    int i, iFanin, nNodeMax = -1;
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        nNodeMax = Abc_MaxInt( nNodeMax, Vec_IntEntry(vCube, 0) );
    nNodeMax++;
    // quit if there is no new nodes
    if ( nNodeMax == nStart )
    {
        //printf( "The network is unchanged by fast extract.\n" );
        return NULL;
    }
    // find first cube and how many cubes
    vFirst = Vec_IntStart( nNodeMax );
    vCount = Vec_IntStart( nNodeMax );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        assert( iFanin >= nInputs );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // put all of them in a topo order
    vOrder = Vec_IntStart( nInputs );
    vVisit = Vec_IntStart( nNodeMax );
    for ( i = 0; i < nInputs; i++ )
        Vec_IntWriteEntry( vVisit, i, 1 );
    for ( i = nInputs; i < nNodeMax; i++ )
        if ( !Vec_IntEntry( vVisit, i ) )
            Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, i );
    assert( Vec_IntSize(vOrder) == nNodeMax );
    Vec_IntFree( vVisit );
    // return topological order of new nodes
    *pvFirst = vFirst;
    *pvCount = vCount;
    return vOrder;
}